

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Check_Field(FIELDTYPE *typ,FIELD *field,TypeArgument *argp)

{
  _Bool _Var1;
  _Bool local_31;
  char *local_30;
  char *bp;
  TypeArgument *argp_local;
  FIELD *field_local;
  FIELDTYPE *typ_local;
  
  if (typ != (FIELDTYPE *)0x0) {
    if ((field->opts & 0x80U) != 0) {
      local_30 = field->buf;
      if (local_30 == (char *)0x0) {
        __assert_fail("bp != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xa88,"_Bool Check_Field(FIELDTYPE *, FIELD *, TypeArgument *)");
      }
      for (; *local_30 == ' '; local_30 = local_30 + 1) {
      }
      if (*local_30 == '\0') {
        return true;
      }
    }
    if ((typ->status & 1) != 0) {
      if (argp != (TypeArgument *)0x0) {
        _Var1 = Check_Field(typ->left,field,argp->left);
        local_31 = true;
        if (!_Var1) {
          local_31 = Check_Field(typ->right,field,argp->right);
        }
        return local_31;
      }
      __assert_fail("argp != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0xa91,"_Bool Check_Field(FIELDTYPE *, FIELD *, TypeArgument *)");
    }
    if (typ->fcheck != (_func__Bool_FIELD_ptr_void_ptr *)0x0) {
      _Var1 = (*typ->fcheck)(field,argp);
      return _Var1;
    }
  }
  return true;
}

Assistant:

static bool Check_Field(FIELDTYPE *typ, FIELD *field, TypeArgument *argp)
{
  if (typ)
    {
      if (field->opts & O_NULLOK)
        {
          char *bp = field->buf;
          assert(bp != 0);
          while(is_blank(*bp))
            { bp++; }
          if (*bp == '\0') 
            return TRUE;
        }

      if (typ->status & _LINKED_TYPE)
        {
          assert(argp != 0);
          return( 
                 Check_Field(typ->left ,field,argp->left ) ||
                 Check_Field(typ->right,field,argp->right) );
        }
      else 
        {
          if (typ->fcheck)
            return typ->fcheck(field,(void *)argp);
        }
    }
  return TRUE;
}